

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BinaryFileFormat.cpp
# Opt level: O0

void __thiscall pbrt::Sampler::readFrom(Sampler *this,BinaryReader *binary)

{
  BinaryReader *in_RDI;
  int samplerType;
  int *in_stack_ffffffffffffffd8;
  undefined4 local_14;
  
  BinaryReader::read<int,void>(in_RDI,in_stack_ffffffffffffffd8);
  *(undefined4 *)&in_RDI->currentEntityOffset = local_14;
  BinaryReader::read<int,void>(in_RDI,in_stack_ffffffffffffffd8);
  BinaryReader::read<int,void>(in_RDI,in_stack_ffffffffffffffd8);
  BinaryReader::read<int,void>(in_RDI,in_stack_ffffffffffffffd8);
  return;
}

Assistant:

void Sampler::readFrom(BinaryReader &binary) {
      int samplerType;
      binary.read(samplerType);
      type = static_cast<Type>(samplerType);
      binary.read(pixelSamples);
      binary.read(xSamples);
      binary.read(ySamples);
  }